

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O3

void __thiscall
cppjieba::Trie::Find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *res,size_t max_word_len)

{
  ulong uVar1;
  pointer pDVar2;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *pvVar6;
  iterator iVar7;
  const_iterator pRVar8;
  const_iterator pRVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_78;
  size_type local_68;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *local_60;
  ulong local_58;
  const_iterator local_50;
  Trie *local_48;
  ulong local_40;
  size_t local_38;
  
  local_48 = this;
  local_38 = max_word_len;
  if (this->root_ == (TrieNode *)0x0) {
    __assert_fail("root_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/Trie.hpp"
                  ,0x55,
                  "void cppjieba::Trie::Find(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<struct Dag> &, size_t) const"
                 );
  }
  local_68 = ((long)end - (long)begin >> 2) * -0x3333333333333333;
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::resize(res,local_68);
  if (end != begin) {
    local_58 = local_68 + (local_68 == 0);
    pRVar8 = begin + 1;
    uVar12 = 0;
    local_60 = res;
    local_50 = begin;
    do {
      pvVar6 = local_60;
      pDVar2 = (local_60->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pDVar2[uVar12].runestr.unicode_length = local_50[uVar12].unicode_length;
      pRVar9 = local_50 + uVar12;
      uVar3 = pRVar9->offset;
      uVar4 = pRVar9->len;
      uVar5 = pRVar9->unicode_offset;
      pDVar2 = pDVar2 + uVar12;
      (pDVar2->runestr).rune = pRVar9->rune;
      (pDVar2->runestr).offset = uVar3;
      (pDVar2->runestr).len = uVar4;
      (pDVar2->runestr).unicode_offset = uVar5;
      this_00 = &local_48->root_->next->_M_h;
      if (this_00 ==
          (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)0x0) {
LAB_0010b552:
        local_78.second = (DictUnit *)0x0;
        local_78.first = uVar12;
        limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                  (&(pvVar6->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar12].nexts,&local_78);
        puVar10 = (undefined8 *)0x0;
      }
      else {
        iVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(this_00,(key_type *)
                               ((local_60->
                                super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                                _M_impl.super__Vector_impl_data._M_start + uVar12));
        if ((iVar7.
             super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
             _M_cur == (__node_type *)0x0) ||
           (puVar10 = *(undefined8 **)
                       ((long)iVar7.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                              ._M_cur + 0x10), puVar10 == (undefined8 *)0x0)) goto LAB_0010b552;
        local_78.second = (DictUnit *)puVar10[1];
        local_78.first = uVar12;
        limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                  (&(pvVar6->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar12].nexts,&local_78);
      }
      local_40 = uVar12 + 1;
      if (local_40 < local_68) {
        uVar11 = 2;
        pRVar9 = pRVar8;
        do {
          if (((puVar10 == (undefined8 *)0x0) || (local_38 < uVar11)) ||
             ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)*puVar10 ==
              (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)0x0)) break;
          iVar7 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)*puVar10,&pRVar9->rune);
          if (iVar7.
              super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>.
              _M_cur == (__node_type *)0x0) break;
          puVar10 = *(undefined8 **)
                     ((long)iVar7.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                            ._M_cur + 0x10);
          if ((DictUnit *)puVar10[1] != (DictUnit *)0x0) {
            local_78.first = (uVar12 + uVar11) - 1;
            local_78.second = (DictUnit *)puVar10[1];
            limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                      (&(local_60->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar12].nexts,&local_78);
          }
          uVar1 = uVar12 + uVar11;
          uVar11 = uVar11 + 1;
          pRVar9 = pRVar9 + 1;
        } while (uVar1 < local_68);
      }
      pRVar8 = pRVar8 + 1;
      uVar12 = local_40;
    } while (local_40 != local_58);
  }
  return;
}

Assistant:

void Find(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<struct Dag>&res, 
        size_t max_word_len = MAX_WORD_LENGTH) const {
    assert(root_ != NULL);
    res.resize(end - begin);

    const TrieNode *ptNode = NULL;
    TrieNode::NextMap::const_iterator citer;
    for (size_t i = 0; i < size_t(end - begin); i++) {
      res[i].runestr = *(begin + i);

      if (root_->next != NULL && root_->next->end() != (citer = root_->next->find(res[i].runestr.rune))) {
        ptNode = citer->second;
      } else {
        ptNode = NULL;
      }
      if (ptNode != NULL) {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, ptNode->ptValue));
      } else {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, static_cast<const DictUnit*>(NULL)));
      }

      for (size_t j = i + 1; j < size_t(end - begin) && (j - i + 1) <= max_word_len; j++) {
        if (ptNode == NULL || ptNode->next == NULL) {
          break;
        }
        citer = ptNode->next->find((begin + j)->rune);
        if (ptNode->next->end() == citer) {
          break;
        }
        ptNode = citer->second;
        if (NULL != ptNode->ptValue) {
          res[i].nexts.push_back(pair<size_t, const DictUnit*>(j, ptNode->ptValue));
        }
      }
    }
  }